

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
__thiscall
testing::internal::NotMatcher::operator_cast_to_Matcher
          (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *__return_storage_ptr__,NotMatcher *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  PolymorphicMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_30,(PolymorphicMatcher *)this);
  *puVar1 = &PTR__NotMatcherImpl_0018f898;
  puVar1[1] = &PTR__MatcherBase_0018f7b8;
  puVar1[2] = local_30.vtable_;
  ((Buffer *)(puVar1 + 3))->shared = (SharedPayloadBase *)local_30.buffer_;
  if ((local_30.vtable_ != (VTable *)0x0) &&
     ((local_30.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_30.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_30.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  puVar1[1] = &PTR__MatcherBase_0018f748;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0018f7b8;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<std::__cxx11::string_const&>::
              GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::MatcherInterface<std::__cxx11::string_const&>const*,true>>()
              ::kVTable_abi_cxx11_;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).buffer_.ptr = puVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0018f748;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_30);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new NotMatcherImpl<T>(SafeMatcherCast<T>(matcher_)));
  }